

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

bool __thiscall Linker::SaveRegVmListing(Linker *this,OutputContext *output,bool withProfileInfo)

{
  uint uVar1;
  ExternSourceInfo *pEVar2;
  RegVmCmd RVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ExternFuncInfo *pEVar7;
  RegVmCmd *pRVar8;
  ExternFuncInfo **ppEVar9;
  ExternTypeInfo *pEVar10;
  char *pcVar11;
  bool bVar12;
  double dVar13;
  undefined4 uVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float local_4bc;
  RegVmInstructionCode local_38c;
  uint count;
  uint i_4;
  double percent_1;
  double percent;
  ExternFuncInfo **func;
  byte bStack_368;
  uchar uStack_367;
  uchar uStack_366;
  uchar uStack_365;
  uint uStack_364;
  bool found;
  RegVmCmd cmd;
  char *codeEnd;
  char *codeStart;
  char *pcStack_348;
  uint i_3;
  char *lastCodeStart;
  char *lastSourcePos;
  uint local_330;
  uint local_32c;
  undefined1 local_328 [4];
  uint i_2;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> regVmFunctionMap;
  undefined1 local_108 [4];
  uint i_1;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> regVmJumpTargetSet;
  uint infoSize;
  ExternSourceInfo *info;
  ulong uStack_58;
  uint i;
  unsigned_long_long total;
  uint lastLine;
  uint line;
  TraceScope traceScope;
  bool withProfileInfo_local;
  OutputContext *output_local;
  Linker *this_local;
  
  if ((SaveRegVmListing(OutputContext&,bool)::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SaveRegVmListing(OutputContext&,bool)::token), iVar4 != 0)) {
    SaveRegVmListing::token = NULLC::TraceGetToken("link","SaveRegVmListing");
    __cxa_guard_release(&SaveRegVmListing(OutputContext&,bool)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&lastLine,SaveRegVmListing::token);
  total._4_4_ = 0;
  total._0_4_ = 0xffffffff;
  uStack_58 = 0;
  if (withProfileInfo) {
    for (info._4_4_ = 0; info._4_4_ < 0x100; info._4_4_ = info._4_4_ + 1) {
      puVar6 = FixedArray<unsigned_int,_256U>::operator[]
                         (&this->exRegVmInstructionExecCount,info._4_4_);
      uStack_58 = *puVar6 + uStack_58;
    }
  }
  pEVar2 = (this->exRegVmSourceInfo).data;
  regVmJumpTargetSet.allocator._4_4_ =
       FastVector<ExternSourceInfo,_false,_false>::size(&this->exRegVmSourceInfo);
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::SmallDenseSet
            ((SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *)local_108,
             (Allocator *)0x0);
  for (regVmFunctionMap.allocator._4_4_ = 0; uVar1 = regVmFunctionMap.allocator._4_4_,
      uVar5 = FastVector<unsigned_int,_false,_false>::size(&this->regVmJumpTargets), uVar1 < uVar5;
      regVmFunctionMap.allocator._4_4_ = regVmFunctionMap.allocator._4_4_ + 1) {
    puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->regVmJumpTargets,regVmFunctionMap.allocator._4_4_);
    SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
              ((SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *)local_108,puVar6);
  }
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::SmallDenseMap
            ((SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *)
             local_328,(Allocator *)0x0);
  for (local_32c = 0; uVar1 = local_32c,
      uVar5 = FastVector<ExternFuncInfo,_false,_false>::size(&this->exFunctions), uVar1 < uVar5;
      local_32c = local_32c + 1) {
    pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[](&this->exFunctions,local_32c);
    local_330 = pEVar7->regVmAddress;
    lastSourcePos =
         (char *)FastVector<ExternFuncInfo,_false,_false>::operator[](&this->exFunctions,local_32c);
    SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
              ((SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *)
               local_328,&local_330,(ExternFuncInfo **)&lastSourcePos);
  }
  lastCodeStart = (this->exSource).data;
  pcStack_348 = (char *)0x0;
  codeStart._4_4_ = 0;
  while( true ) {
    uVar1 = codeStart._4_4_;
    bVar12 = false;
    if (regVmJumpTargetSet.allocator._4_4_ != 0) {
      uVar5 = FastVector<RegVmCmd,_false,_false>::size(&this->exRegVmCode);
      bVar12 = uVar1 < uVar5;
    }
    if (!bVar12) break;
    while( true ) {
      bVar12 = false;
      if (total._4_4_ < regVmJumpTargetSet.allocator._4_4_ - 1) {
        bVar12 = pEVar2[total._4_4_ + 1].instruction <= codeStart._4_4_;
      }
      if (!bVar12) break;
      total._4_4_ = total._4_4_ + 1;
    }
    if (total._4_4_ != (uint)total) {
      total._0_4_ = total._4_4_;
      codeEnd = (this->exSource).data + pEVar2[total._4_4_].sourceOffset;
      while( true ) {
        bVar12 = false;
        if (codeEnd != (this->exSource).data) {
          bVar12 = codeEnd[-1] != '\n';
        }
        if (!bVar12) break;
        codeEnd = codeEnd + -1;
      }
      while( true ) {
        bVar12 = true;
        if (*codeEnd != ' ') {
          bVar12 = *codeEnd == '\t';
        }
        if (!bVar12) break;
        codeEnd = codeEnd + 1;
      }
      cmd = (RegVmCmd)codeEnd;
      while( true ) {
        bVar12 = false;
        if ((*(char *)cmd != '\0') && (bVar12 = false, *(char *)cmd != '\r')) {
          bVar12 = *(char *)cmd != '\n';
        }
        if (!bVar12) break;
        cmd = (RegVmCmd)((long)cmd + 1);
      }
      if (lastCodeStart < (ulong)cmd) {
        OutputContext::Printf(output,"%.*s\r\n",(ulong)(uint)(cmd._0_4_ - (int)lastCodeStart));
        lastCodeStart = (char *)cmd;
      }
      else {
        if (codeEnd != pcStack_348) {
          OutputContext::Printf(output,"%.*s\r\n",(ulong)(uint)(cmd._0_4_ - (int)codeEnd));
        }
        pcStack_348 = codeEnd;
      }
    }
    pRVar8 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exRegVmCode,codeStart._4_4_);
    RVar3 = *pRVar8;
    bVar12 = SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::contains
                       ((SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *)local_108,
                        (uint *)((long)&codeStart + 4));
    ppEVar9 = SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::find
                        ((SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>
                          *)local_328,(uint *)((long)&codeStart + 4));
    if (ppEVar9 != (ExternFuncInfo **)0x0) {
      OutputContext::Printf
                (output,"// %s#%d\n",(this->exSymbols).data + (*ppEVar9)->offsetToName,
                 (ulong)(uint)((int)((ulong)((long)*ppEVar9 - (long)(this->exFunctions).data) >> 2)
                              * -0x6eb3e453));
    }
    if (withProfileInfo) {
      uVar16 = (undefined4)(uStack_58 >> 0x20);
      if (bVar12) {
        OutputContext::Printf(output,"//            %4d:\n",(ulong)codeStart._4_4_);
        puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmExecCount,codeStart._4_4_);
        auVar14._8_4_ = uVar16;
        auVar14._0_8_ = uStack_58;
        auVar14._12_4_ = 0x45300000;
        dVar13 = ((double)*puVar6 /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uStack_58) - 4503599627370496.0))) * 100.0;
        if (dVar13 <= 0.1) {
          puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->exRegVmExecCount,codeStart._4_4_);
          OutputContext::Printf(output,"// (%8d     )      ",(ulong)*puVar6);
        }
        else {
          puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->exRegVmExecCount,codeStart._4_4_);
          OutputContext::Printf(output,"// (%8d %4.1f)      ",dVar13,(ulong)*puVar6);
        }
      }
      else {
        puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->exRegVmExecCount,codeStart._4_4_);
        auVar15._8_4_ = uVar16;
        auVar15._0_8_ = uStack_58;
        auVar15._12_4_ = 0x45300000;
        dVar13 = ((double)*puVar6 /
                 ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uStack_58) - 4503599627370496.0))) * 100.0;
        if (dVar13 <= 0.1) {
          puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->exRegVmExecCount,codeStart._4_4_);
          OutputContext::Printf(output,"// (%8d     ) %4d ",(ulong)*puVar6,(ulong)codeStart._4_4_);
        }
        else {
          puVar6 = FastVector<unsigned_int,_false,_false>::operator[]
                             (&this->exRegVmExecCount,codeStart._4_4_);
          OutputContext::Printf
                    (output,"// (%8d %4.1f) %4d ",dVar13,(ulong)*puVar6,(ulong)codeStart._4_4_);
        }
      }
    }
    else if (bVar12) {
      OutputContext::Printf(output,"// %4d:\n",(ulong)codeStart._4_4_);
      OutputContext::Printf(output,"//      ");
    }
    else {
      OutputContext::Printf(output,"// %4d ",(ulong)codeStart._4_4_);
    }
    bStack_368 = RVar3.code;
    uStack_367 = RVar3.rA;
    uStack_366 = RVar3.rB;
    uStack_365 = RVar3.rC;
    uStack_364 = RVar3.argument;
    PrintInstruction(output,(char *)(this->exRegVmConstants).data,(this->exFunctions).data,
                     (this->exSymbols).data,(uint)bStack_368,uStack_367,uStack_366,uStack_365,
                     uStack_364,(VmConstant *)0x0);
    if ((bStack_368 == 0x20) || (bStack_368 == 0x5f)) {
      pcVar11 = (this->exSymbols).data;
      pRVar8 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exRegVmCode,codeStart._4_4_);
      pEVar7 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         (&this->exFunctions,pRVar8->argument);
      OutputContext::Printf(output," (%s)",pcVar11 + pEVar7->offsetToName);
    }
    else if (bStack_368 == 0x5e) {
      pcVar11 = (this->exSymbols).data;
      pRVar8 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exRegVmCode,codeStart._4_4_);
      pEVar10 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                          (&this->exTypes,pRVar8->argument);
      OutputContext::Printf(output," (%s)",pcVar11 + pEVar10->offsetToName);
    }
    OutputContext::Printf(output,"\n");
    codeStart._4_4_ = codeStart._4_4_ + 1;
  }
  if (withProfileInfo) {
    OutputContext::Printf(output,"\n");
    for (local_38c = rviNop; local_38c < 0x100; local_38c = local_38c + rviLoadByte) {
      puVar6 = FixedArray<unsigned_int,_256U>::operator[]
                         (&this->exRegVmInstructionExecCount,local_38c);
      uVar1 = *puVar6;
      if (uVar1 != 0) {
        pcVar11 = GetInstructionName(local_38c);
        local_4bc = (float)uStack_58;
        OutputContext::Printf
                  (output,"// %9s: %10d (%4.1f%%)\n",(double)((float)uVar1 / local_4bc) * 100.0,
                   pcVar11,(ulong)uVar1);
      }
    }
    OutputContext::Printf(output,"// %9s: %10lld (%4.0f%%)\n",0x4059000000000000,"total",uStack_58);
  }
  OutputContext::Flush(output);
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseMap
            ((SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *)
             local_328);
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseSet
            ((SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *)local_108);
  NULLC::TraceScope::~TraceScope((TraceScope *)&lastLine);
  return true;
}

Assistant:

bool Linker::SaveRegVmListing(OutputContext &output, bool withProfileInfo)
{
	TRACE_SCOPE("link", "SaveRegVmListing");

	unsigned line = 0, lastLine = ~0u;

	unsigned long long total = 0;

	if(withProfileInfo)
	{
		for(unsigned i = 0; i < 256; i++)
			total += exRegVmInstructionExecCount[i];
	}

	ExternSourceInfo *info = (ExternSourceInfo*)exRegVmSourceInfo.data;
	unsigned infoSize = exRegVmSourceInfo.size();

	SmallDenseSet<unsigned, SmallDenseMapUnsignedHasher, 32> regVmJumpTargetSet;

	for(unsigned i = 0; i < regVmJumpTargets.size(); i++)
		regVmJumpTargetSet.insert(regVmJumpTargets[i]);

	SmallDenseMap<unsigned, ExternFuncInfo*, SmallDenseMapUnsignedHasher, 32> regVmFunctionMap;

	for(unsigned i = 0; i < exFunctions.size(); i++)
		regVmFunctionMap.insert(exFunctions[i].regVmAddress, &exFunctions[i]);

	const char *lastSourcePos = exSource.data;
	const char *lastCodeStart = NULL;

	for(unsigned i = 0; infoSize && i < exRegVmCode.size(); i++)
	{
		while((line < infoSize - 1) && (i >= info[line + 1].instruction))
			line++;

		if(line != lastLine)
		{
			lastLine = line;

			const char *codeStart = exSource.data + info[line].sourceOffset;

			// Find beginning of the line
			while(codeStart != exSource.data && *(codeStart-1) != '\n')
				codeStart--;

			// Skip whitespace
			while(*codeStart == ' ' || *codeStart == '\t')
				codeStart++;

			const char *codeEnd = codeStart;
			while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
				codeEnd++;

			if(codeEnd > lastSourcePos)
			{
				output.Printf("%.*s\r\n", int(codeEnd - lastSourcePos), lastSourcePos);
				lastSourcePos = codeEnd;
			}
			else
			{
				if(codeStart != lastCodeStart)
					output.Printf("%.*s\r\n", int(codeEnd - codeStart), codeStart);

				lastCodeStart = codeStart;
			}
		}

		RegVmCmd cmd = exRegVmCode[i];

		bool found = regVmJumpTargetSet.contains(i);

		if(ExternFuncInfo **func = regVmFunctionMap.find(i))
			output.Printf("// %s#%d\n", exSymbols.data + (*func)->offsetToName, unsigned(*func - exFunctions.data));

		if(withProfileInfo)
		{
			if(found)
			{
				output.Printf("//            %4d:\n", i);

				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f)      ", exRegVmExecCount[i], percent);
				else
					output.Printf("// (%8d     )      ", exRegVmExecCount[i]);
			}
			else
			{
				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f) %4d ", exRegVmExecCount[i], percent, i);
				else
					output.Printf("// (%8d     ) %4d ", exRegVmExecCount[i], i);
			}
		}
		else
		{
			if(found)
			{
				output.Printf("// %4d:\n", i);
				output.Printf("//      ");
			}
			else
			{
				output.Printf("// %4d ", i);
			}
		}

		PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

		if(cmd.code == rviCall || cmd.code == rviFuncAddr)
			output.Printf(" (%s)", exSymbols.data + exFunctions[exRegVmCode[i].argument].offsetToName);
		else if(cmd.code == rviConvertPtr)
			output.Printf(" (%s)", exSymbols.data + exTypes[exRegVmCode[i].argument].offsetToName);

		output.Printf("\n");
	}

	if(withProfileInfo)
	{
		output.Printf("\n");

		for(unsigned i = 0; i < 256; i++)
		{
			if(unsigned count = exRegVmInstructionExecCount[i])
				output.Printf("// %9s: %10d (%4.1f%%)\n", GetInstructionName(RegVmInstructionCode(i)), count, float(count) / total * 100.0);
		}

		output.Printf("// %9s: %10lld (%4.0f%%)\n", "total", total, 100.0);
	}

	output.Flush();

	return true;
}